

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

QPointF __thiscall QWidgetTextControl::anchorPosition(QWidgetTextControl *this,QString *name)

{
  QWidgetTextControlPrivate *this_00;
  undefined1 auVar1 [16];
  char cVar2;
  int iVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  char local_114;
  double local_108;
  ulong local_f8;
  double dStack_f0;
  QArrayDataPointer<QString> local_e0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  QArrayDataPointer<QString> local_b0;
  undefined1 local_98 [12];
  int iStack_8c;
  undefined1 *local_88;
  QRectF local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((name->d).size != 0) {
    this_00 = *(QWidgetTextControlPrivate **)(this + 8);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::begin();
    cVar2 = QTextBlock::isValid();
    local_f8 = 0;
    if (cVar2 == '\0') goto LAB_004d138d;
    local_f8 = 0;
    dStack_f0 = 0.0;
    local_108 = 0.0;
    do {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::charFormat();
      iVar3 = (int)(QTextFormat *)&local_58;
      cVar2 = QTextFormat::boolProperty(iVar3);
      if (cVar2 == '\0') {
        local_114 = '\0';
      }
      else {
        QTextCharFormat::anchorNames();
        QVar4.m_data = (name->d).ptr;
        QVar4.m_size = (name->d).size;
        local_114 = QtPrivate::QStringList_contains((QList_conflict *)&local_b0,QVar4,CaseSensitive)
        ;
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_b0);
      }
      if (local_114 == '\0') {
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        stack0xffffffffffffff70 = &DAT_aaaaaaaaaaaaaaaa;
        QTextBlock::begin();
        while( true ) {
          if ((int)local_88 == iStack_8c) break;
          local_c8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
          QTextBlock::iterator::fragment();
          QTextFragment::charFormat();
          QTextFormat::operator=((QTextFormat *)&local_58,(QTextFormat *)&local_78);
          QTextFormat::~QTextFormat((QTextFormat *)&local_78);
          cVar2 = QTextFormat::boolProperty(iVar3);
          if (cVar2 == '\0') {
            cVar2 = '\0';
          }
          else {
            QTextCharFormat::anchorNames();
            QVar5.m_data = (name->d).ptr;
            QVar5.m_size = (name->d).size;
            cVar2 = QtPrivate::QStringList_contains((QList_conflict *)&local_e0,QVar5,CaseSensitive)
            ;
            QArrayDataPointer<QString>::~QArrayDataPointer(&local_e0);
          }
          if (cVar2 != '\0') {
            iVar3 = QTextFragment::position();
            QWidgetTextControlPrivate::rectForPosition(&local_78,this_00,iVar3);
            local_f8 = CONCAT44(local_78.yp._4_4_,local_78.yp._0_4_);
            dStack_f0 = local_78.w;
            local_108 = local_78.h;
            local_48 = (undefined1 *)0x0;
            puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffff00000000);
            break;
          }
          QTextBlock::iterator::operator++((iterator *)local_98);
        }
      }
      else {
        iVar3 = QTextBlock::position();
        QWidgetTextControlPrivate::rectForPosition(&local_78,this_00,iVar3);
        local_f8 = CONCAT44(local_78.yp._4_4_,local_78.yp._0_4_);
        dStack_f0 = local_78.w;
        local_108 = local_78.h;
      }
      QTextFormat::~QTextFormat((QTextFormat *)&local_58);
      if (local_114 != '\0') break;
      QTextBlock::next();
      local_48 = (undefined1 *)local_78.xp;
      puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,local_78.yp._0_4_);
      cVar2 = QTextBlock::isValid();
    } while (cVar2 != '\0');
    if (0.0 < local_108 && 0.0 < dStack_f0) goto LAB_004d138d;
  }
  local_f8 = 0;
LAB_004d138d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_f8;
  return (QPointF)(auVar1 << 0x40);
}

Assistant:

QPointF QWidgetTextControl::anchorPosition(const QString &name) const
{
    Q_D(const QWidgetTextControl);
    if (name.isEmpty())
        return QPointF();

    QRectF r;
    for (QTextBlock block = d->doc->begin(); block.isValid(); block = block.next()) {
        QTextCharFormat format = block.charFormat();
        if (format.isAnchor() && format.anchorNames().contains(name)) {
            r = d->rectForPosition(block.position());
            break;
        }

        for (QTextBlock::Iterator it = block.begin(); !it.atEnd(); ++it) {
            QTextFragment fragment = it.fragment();
            format = fragment.charFormat();
            if (format.isAnchor() && format.anchorNames().contains(name)) {
                r = d->rectForPosition(fragment.position());
                block = QTextBlock();
                break;
            }
        }
    }
    if (!r.isValid())
        return QPointF();
    return QPointF(0, r.top());
}